

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O2

void __thiscall
FOOLElimination::collectSorts
          (FOOLElimination *this,VList *vars,TermStack *typeVars,TermStack *termVars,
          TermStack *allVars,TermStack *termVarSorts)

{
  uint uVar1;
  TermList TVar2;
  TermList TVar3;
  
  while (vars != (VList *)0x0) {
    uVar1 = vars->_head;
    vars = vars->_tail;
    TVar2 = Kernel::AtomicSort::defaultSort();
    TVar2 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                      (&this->_varSorts,uVar1,TVar2);
    TVar3 = Kernel::AtomicSort::superSort();
    if (TVar2._content == TVar3._content) {
      TVar3._content._4_4_ = 0;
      TVar3._content._0_4_ = uVar1 * 4 + 1;
      Lib::Stack<Kernel::TermList>::push(allVars,TVar3);
      Lib::Stack<Kernel::TermList>::push(typeVars,TVar3);
    }
    else {
      Lib::Stack<Kernel::TermList>::push(termVarSorts,TVar2);
      TVar2._content._4_4_ = 0;
      TVar2._content._0_4_ = uVar1 * 4 + 1;
      Lib::Stack<Kernel::TermList>::push(termVars,TVar2);
    }
  }
  uVar1 = 0;
  while( true ) {
    if ((ulong)((long)termVars->_cursor - (long)termVars->_stack >> 3) <= (ulong)uVar1) break;
    Lib::Stack<Kernel::TermList>::push(allVars,(TermList)termVars->_stack[uVar1]._content);
    uVar1 = uVar1 + 1;
  }
  Kernel::SortHelper::normaliseArgSorts(typeVars,termVarSorts);
  return;
}

Assistant:

void FOOLElimination::collectSorts(VList* vars, TermStack& typeVars,
                                   TermStack& termVars, TermStack& allVars, TermStack& termVarSorts)
{
  VList::Iterator fvi(vars);
  while (fvi.hasNext()) {
    unsigned var = fvi.next();
    ASS_REP(_varSorts.find(var), var);
    TermList sort = _varSorts.get(var, AtomicSort::defaultSort());
    if(sort == AtomicSort::superSort()){
      //variable is a type var
      allVars.push(TermList(var, false));
      typeVars.push(TermList(var, false));
    } else {
      termVarSorts.push(sort);
      termVars.push(TermList(var, false));
    }   
  }
  
  for(unsigned i = 0; i < termVars.size(); i++){
    allVars.push(termVars[i]);
  }

  SortHelper::normaliseArgSorts(typeVars, termVarSorts);
}